

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::PtnSkeleton::getBaseSkeleton(UnicodeString *__return_storage_ptr__,PtnSkeleton *this)

{
  uint uVar1;
  UnicodeString *src;
  int32_t pos;
  PtnSkeleton *this_local;
  UnicodeString *result;
  
  icu_63::UnicodeString::UnicodeString(__return_storage_ptr__);
  src = SkeletonFields::appendTo(&this->baseOriginal,__return_storage_ptr__);
  icu_63::UnicodeString::operator=(__return_storage_ptr__,src);
  if ((this->addedDefaultDayPeriod != '\0') &&
     (uVar1 = icu_63::UnicodeString::indexOf(__return_storage_ptr__,L'a'), -1 < (int)uVar1)) {
    icu_63::UnicodeString::remove(__return_storage_ptr__,(char *)(ulong)uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PtnSkeleton::getBaseSkeleton() const {
    UnicodeString result;
    result = baseOriginal.appendTo(result);
    int32_t pos;
    if (addedDefaultDayPeriod && (pos = result.indexOf(LOW_A)) >= 0) {
        // for backward compatibility: if DateTimeMatcher.set added a single 'a' that
        // was not in the provided skeleton, remove it here before returning skeleton.
        result.remove(pos, 1);
    }
    return result;
}